

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

AssertionItemPortSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssertionItemPortSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::syntax::EqualsAssertionArgClauseSyntax*>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,DataTypeSyntax *args_3,Token *args_4,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_5,
          EqualsAssertionArgClauseSyntax **args_6)

{
  Token direction;
  Token local;
  Token name;
  AssertionItemPortSyntax *this_00;
  
  this_00 = (AssertionItemPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AssertionItemPortSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (AssertionItemPortSyntax *)allocateSlow(this,200,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  local.kind = args_1->kind;
  local._2_1_ = args_1->field_0x2;
  local.numFlags.raw = (args_1->numFlags).raw;
  local.rawLen = args_1->rawLen;
  local.info = args_1->info;
  direction.kind = args_2->kind;
  direction._2_1_ = args_2->field_0x2;
  direction.numFlags.raw = (args_2->numFlags).raw;
  direction.rawLen = args_2->rawLen;
  direction.info = args_2->info;
  name.kind = args_4->kind;
  name._2_1_ = args_4->field_0x2;
  name.numFlags.raw = (args_4->numFlags).raw;
  name.rawLen = args_4->rawLen;
  name.info = args_4->info;
  slang::syntax::AssertionItemPortSyntax::AssertionItemPortSyntax
            (this_00,args,local,direction,args_3,name,args_5,*args_6);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }